

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * get_cpu_name(void)

{
  FILE *__stream;
  char *pcVar1;
  ushort **ppuVar2;
  char *local_40;
  char *dest;
  char *src;
  int is_pipe;
  FILE *file;
  char *search;
  char *name;
  
  search = "Unknown";
  __stream = fopen("/proc/cpuinfo","r");
  do {
    pcVar1 = fgets(get_cpu_name::buffer,0x200,__stream);
    if (pcVar1 == (char *)0x0) goto LAB_00101be7;
    pcVar1 = strstr(get_cpu_name::buffer,"model name");
  } while ((pcVar1 == (char *)0x0) ||
          (dest = strchr(get_cpu_name::buffer,0x3a), dest == (char *)0x0));
  do {
    local_40 = dest;
    dest = local_40 + 1;
    ppuVar2 = __ctype_b_loc();
  } while (((*ppuVar2)[(int)*dest] & 0x2000) != 0);
  search = dest;
  local_40 = local_40 + 2;
  for (dest = local_40; *dest != '\0'; dest = dest + 1) {
    ppuVar2 = __ctype_b_loc();
    if ((((*ppuVar2)[(int)*dest] & 0x2000) == 0) ||
       (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)local_40[-1]] & 0x2000) == 0)) {
      *local_40 = *dest;
      local_40 = local_40 + 1;
    }
  }
  *local_40 = '\0';
LAB_00101be7:
  fclose(__stream);
  return search;
}

Assistant:

const char *
get_cpu_name (void)
{
	const char *name = "Unknown", *search = NULL ;
	static char buffer [512] ;
	FILE * file = NULL ;
	int is_pipe = 0 ;

#if defined (__linux__)
	file = fopen ("/proc/cpuinfo", "r") ;
	search = "model name" ;
#elif defined (__APPLE__)
	file = popen ("/usr/sbin/system_profiler -detailLevel full SPHardwareDataType", "r") ;
	search = "Processor Name" ;
	is_pipe = 1 ;
#elif defined (__FreeBSD__) || defined (__OpenBSD__)
	file = popen ("sysctl -a", "r") ;
	search = "hw.model" ;
	is_pipe = 1 ;
#else
	(void) search ;
	(void) buffer ;
	(void) file ;
	(void) is_pipe ;

	return name;
#endif

#if defined (__linux__) || defined (__APPLE__) || defined (__FreeBSD__) || defined (__OpenBSD__)
	if (search == NULL)
	{	printf ("Error : search is NULL in function %s.\n", __func__) ;
		return name ;
		} ;

	while (fgets (buffer, sizeof (buffer), file) != NULL)
		if (strstr (buffer, search))
		{	char *src, *dest ;

			if ((src = strchr (buffer, ':')) != NULL)
			{	src ++ ;
				while (isspace (src [0]))
					src ++ ;
				name = src ;

				/* Remove consecutive spaces. */
				src ++ ;
				for (dest = src ; src [0] ; src ++)
				{	if (isspace (src [0]) && isspace (dest [-1]))
						continue ;
					dest [0] = src [0] ;
					dest ++ ;
					} ;
				dest [0] = 0 ;
				break ;
				} ;
			} ;

	if (is_pipe)
		pclose (file) ;
	else
		fclose (file) ;

	return name ;
#endif
}